

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_lzmasdk.h
# Opt level: O0

SRes ReadUi32s(CSzData *sd2,UInt32 numItems,CSzBitUi32s *crcs,ISzAlloc *alloc)

{
  Byte *pBVar1;
  UInt32 *pUVar2;
  Byte *defs;
  UInt32 *vals;
  CSzData sd;
  UInt32 i;
  ISzAlloc *alloc_local;
  CSzBitUi32s *crcs_local;
  UInt32 numItems_local;
  CSzData *sd2_local;
  
  if (numItems == 0) {
    crcs->Vals = (UInt32 *)0x0;
  }
  else {
    pUVar2 = (UInt32 *)(*alloc->Alloc)(alloc,(ulong)numItems << 2);
    crcs->Vals = pUVar2;
    if (pUVar2 == (UInt32 *)0x0) {
      return 2;
    }
  }
  vals = (UInt32 *)sd2->Data;
  sd.Data = (Byte *)sd2->Size;
  pBVar1 = crcs->Defs;
  pUVar2 = crcs->Vals;
  sd.Size._4_4_ = 0;
  do {
    if (numItems <= sd.Size._4_4_) {
      sd2->Data = (Byte *)vals;
      sd2->Size = (size_t)sd.Data;
      return 0;
    }
    if (((uint)pBVar1[sd.Size._4_4_ >> 3] & 0x80 >> ((byte)sd.Size._4_4_ & 7)) == 0) {
      pUVar2[sd.Size._4_4_] = 0;
    }
    else {
      if (sd.Data < (Byte *)0x4) {
        return 0x10;
      }
      pUVar2[sd.Size._4_4_] = *vals;
      sd.Data = sd.Data + -4;
      vals = vals + 1;
    }
    sd.Size._4_4_ = sd.Size._4_4_ + 1;
  } while( true );
}

Assistant:

static MY_NO_INLINE SRes ReadUi32s(CSzData *sd2, UInt32 numItems, CSzBitUi32s *crcs, ISzAlloc *alloc)
{
  UInt32 i;
  CSzData sd;
  UInt32 *vals;
  const Byte *defs;
  MY_ALLOC_ZE(UInt32, crcs->Vals, numItems, alloc);
  sd = *sd2;
  defs = crcs->Defs;
  vals = crcs->Vals;
  for (i = 0; i < numItems; i++)
    if (SzBitArray_Check(defs, i))
    {
      SZ_READ_32(vals[i]);
    }
    else
      vals[i] = 0;
  *sd2 = sd;
  return SZ_OK;
}